

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_csv_parser.cpp
# Opt level: O0

size_t __thiscall csv::internals::get_file_size(internals *this,string_view filename)

{
  size_t sVar1;
  fpos<__mbstate_t> local_278 [8];
  pos_type end;
  fpos<__mbstate_t> local_268 [8];
  pos_type start;
  allocator<char> local_241;
  string local_240 [32];
  undefined1 local_220 [8];
  ifstream infile;
  undefined1 local_18 [8];
  string_view filename_local;
  
  filename_local._M_len = filename._M_len;
  local_18 = (undefined1  [8])this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_240,(basic_string_view<char,_std::char_traits<char>_> *)local_18,&local_241);
  std::ifstream::ifstream(local_220,local_240,_S_bin);
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator(&local_241);
  _local_268 = std::istream::tellg();
  std::istream::seekg((long)local_220,_S_beg);
  _local_278 = std::istream::tellg();
  sVar1 = std::fpos<__mbstate_t>::operator-(local_278,local_268);
  std::ifstream::~ifstream(local_220);
  return sVar1;
}

Assistant:

CSV_INLINE size_t get_file_size(csv::string_view filename) {
            std::ifstream infile(std::string(filename), std::ios::binary);
            const auto start = infile.tellg();
            infile.seekg(0, std::ios::end);
            const auto end = infile.tellg();

            return end - start;
        }